

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.hpp
# Opt level: O3

void __thiscall wire::string::string<unsigned_int>(string *this,uint *t)

{
  ostream *poVar1;
  stringstream ss;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  stringstream local_1a0 [16];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  (this->super_string)._M_dataplus._M_p = (pointer)&(this->super_string).field_2;
  (this->super_string)._M_string_length = 0;
  (this->super_string).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  if (((byte)poVar1[*(long *)(*(long *)poVar1 + -0x18) + 0x20] & 5) == 0) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)this,(string *)local_1c0);
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0]);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

string( const T &t ) : std::string()
        {
            std::stringstream ss;
            if( ss << /* std::boolalpha << */ t )
                this->assign( ss.str() );
        }